

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrCMP0xcd(CPU *this)

{
  byte bVar1;
  Memory *this_00;
  byte bVar2;
  uint16_t uVar3;
  uint uVar4;
  
  bVar1 = this->A;
  this_00 = this->m;
  uVar3 = this->PC;
  this->PC = uVar3 + 2;
  uVar3 = Memory::Read16(this_00,uVar3);
  bVar2 = Memory::Read8(this_00,uVar3);
  uVar4 = (uint)bVar1 - (uint)bVar2;
  this->field_0x2e =
       (bVar1 == bVar2) << 6 | this->field_0x2e & 0x3e | ((uVar4 & 0xff00) == 0) << 7 |
       (byte)uVar4 >> 7;
  return 4;
}

Assistant:

int CPU::instrCMP0xcd() {
	CMP(A, absolute_addr());
	return 4;
}